

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O1

uint32_t __thiscall cppnet::TimerContainer::TimerRun(TimerContainer *this,uint32_t time)

{
  TIME_UNIT TVar1;
  element_type *peVar2;
  int iVar3;
  uint32_t uVar4;
  bool bVar5;
  uint32_t time_pass;
  vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
  sub_timer_solts;
  vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
  run_timer_solts;
  uint32_t local_6c;
  vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
  local_68;
  vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
  local_48;
  
  TVar1 = this->_time_unit;
  bVar5 = TVar1 <= time;
  time_pass = (uint32_t)((ulong)time % (ulong)TVar1);
  if (time_pass != 0) {
    peVar2 = (this->_sub_timer).
             super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (*(peVar2->super_Timer)._vptr_Timer[4])(peVar2,(ulong)time % (ulong)TVar1);
    bVar5 = iVar3 != 0 || TVar1 <= time;
    this->_cur_time = this->_cur_time + iVar3;
  }
  if (bVar5) {
    local_48.
    super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.
    super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.
    super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar4 = this->_cur_time;
    this->_cur_time = time / TVar1 + uVar4;
    while (uVar4 = Bitmap::GetMinAfter(&this->_bitmap,uVar4),
          (int)uVar4 <= (int)this->_cur_time && -1 < (int)uVar4) {
      GetIndexTimer(this,&local_48,&local_68,uVar4,time_pass);
      uVar4 = uVar4 + 1;
    }
    local_6c = 0;
    if (this->_size <= this->_cur_time) {
      this->_cur_time = this->_cur_time - this->_size;
      local_6c = 1;
      uVar4 = 0;
      while (uVar4 = Bitmap::GetMinAfter(&this->_bitmap,uVar4),
            (int)uVar4 <= (int)this->_cur_time && -1 < (int)uVar4) {
        GetIndexTimer(this,&local_48,&local_68,uVar4,time_pass);
        uVar4 = uVar4 + 1;
      }
    }
    DoTimer(this,&local_48,&local_68);
    std::
    vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>::
    ~vector(&local_68);
    std::
    vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>::
    ~vector(&local_48);
  }
  else {
    local_6c = 0;
    if (this->_size <= this->_cur_time) {
      this->_cur_time = this->_cur_time - this->_size;
      local_6c = 1;
    }
  }
  return local_6c;
}

Assistant:

uint32_t TimerContainer::TimerRun(uint32_t time) {
    uint32_t time_pass = time / _time_unit;
    uint32_t left_time = time % _time_unit;
    bool do_timer = time_pass > 0;

    if (left_time > 0) {
        uint32_t sub_run_step = _sub_timer->TimerRun(left_time);
        if (sub_run_step > 0) {
            do_timer = true;
        }
        _cur_time += sub_run_step;
    }

    if (!do_timer) {
        uint32_t run_setp = 0;
        if (_cur_time >= _size) {
            _cur_time -= _size;
            run_setp++;
        }
        return run_setp;
    }

    std::vector<std::weak_ptr<TimerSlot>> run_timer_solts;
    std::vector<std::weak_ptr<TimerSlot>> sub_timer_solts;

    uint32_t prev_time = _cur_time;
    _cur_time += time_pass;
    while(1) {
        int32_t next_time = _bitmap.GetMinAfter(prev_time);
        if (next_time < 0) {
            break;
        }
        if (next_time > (int32_t)_cur_time) {
            break;
        }
        GetIndexTimer(run_timer_solts, sub_timer_solts, next_time, left_time);
        prev_time = next_time + 1;
    }

    uint32_t run_setp = 0;
    if (_cur_time >= _size) {
        _cur_time -= _size;
        run_setp++;
    }

    if (run_setp > 0) {
        prev_time = 0;
        while (1) {
            int32_t next_time = _bitmap.GetMinAfter(prev_time);
            if (next_time < 0) {
                break;
            }
            if (next_time > (int32_t)_cur_time) {
                break;
            }
            GetIndexTimer(run_timer_solts, sub_timer_solts, next_time, left_time);
            prev_time = next_time + 1;
        }
    }

    // timer call back
    DoTimer(run_timer_solts, sub_timer_solts);

    return run_setp;
}